

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMockerBase<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)>::
UntypedPerformAction
          (FunctionMockerBase<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)> *this,
          void *untyped_action,void *untyped_args)

{
  ActionResultHolder<TestExprBuilder<3,_BasicTestExpr<2>_>_> *pAVar1;
  Action<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)> action;
  linked_ptr<testing::ActionInterface<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)>_> local_20;
  
  linked_ptr<testing::ActionInterface<TestExprBuilder<3,BasicTestExpr<2>>(int)>>::
  copy<testing::ActionInterface<TestExprBuilder<3,BasicTestExpr<2>>(int)>>
            ((linked_ptr<testing::ActionInterface<TestExprBuilder<3,BasicTestExpr<2>>(int)>> *)
             &local_20,
             (linked_ptr<testing::ActionInterface<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)>_> *)
             untyped_action);
  pAVar1 = ActionResultHolder<TestExprBuilder<3,BasicTestExpr<2>>>::
           PerformAction<TestExprBuilder<3,BasicTestExpr<2>>(int)>
                     ((Action<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)> *)&local_20,
                      (ArgumentTuple *)untyped_args);
  linked_ptr<testing::ActionInterface<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)>_>::~linked_ptr
            (&local_20);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }